

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O2

gnode_t * gnode_label_stat_create(gtoken_s token,gnode_t *expr,gnode_t *stmt,gnode_t *decl)

{
  gnode_t *pgVar1;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0x60);
  pgVar1->tag = NODE_LABEL_STAT;
  (pgVar1->token).type = token.type;
  (pgVar1->token).lineno = token.lineno;
  (pgVar1->token).colno = token.colno;
  (pgVar1->token).position = token.position;
  (pgVar1->token).bytes = token.bytes;
  (pgVar1->token).length = token.length;
  (pgVar1->token).fileid = token.fileid;
  (pgVar1->token).builtin = token.builtin;
  (pgVar1->token).value = token.value;
  pgVar1->decl = decl;
  *(gnode_t **)(pgVar1 + 1) = expr;
  *(gnode_t **)&pgVar1[1].block_length = stmt;
  return pgVar1;
}

Assistant:

gnode_t *gnode_label_stat_create (gtoken_s token, gnode_t *expr, gnode_t *stmt, gnode_t *decl) {
    gnode_label_stmt_t *node = (gnode_label_stmt_t *)mem_alloc(NULL, sizeof(gnode_label_stmt_t));

    SETBASE(node, NODE_LABEL_STAT, token);
    SETDECL(node, decl);
    node->expr = expr;
    node->stmt = stmt;
    return (gnode_t *)node;
}